

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O0

int __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
::
MapFind__Impl<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AbsId>>
          (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           *this,CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>
                 *con)

{
  bool bVar1;
  pointer pvVar2;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_RDI;
  const_iterator it;
  ConstraintMap<AbsConstraint> *map;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>
  *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar3;
  _Node_iterator_base<std::pair<const_std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>,_int>,_true>
  local_30 [2];
  _Node_iterator_base<std::pair<const_std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>,_int>,_true>
  local_20;
  ConstraintMap<AbsConstraint> *local_18;
  
  local_18 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::GetConstraintMap(in_RDI,(AbsConstraint *)0x0);
  std::
  reference_wrapper<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AbsId>const>
  ::
  reference_wrapper<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AbsId>const&,void,mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AbsId>const*>
            ((reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>
              *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>,_int,_std::hash<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>_>,_std::equal_to<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>,_int>_>_>
       ::find((unordered_map<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>,_int,_std::hash<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>_>,_std::equal_to<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>,_int>_>_>
               *)in_stack_ffffffffffffffb8,(key_type *)0x3e2839);
  local_30[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>,_int,_std::hash<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>_>,_std::equal_to<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>,_int>_>_>
       ::end((unordered_map<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>,_int,_std::hash<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>_>,_std::equal_to<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>,_int>_>_>
              *)in_stack_ffffffffffffffb8);
  bVar1 = std::__detail::operator!=(local_30,&local_20);
  if (bVar1) {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>,_int>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>,_int>,_false,_true>
                           *)0x3e286c);
    iVar3 = pvVar2->second;
  }
  else {
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int MapFind__Impl(const Constraint& con) {
    const auto& map = GET_CONST_CONSTRAINT_MAP(Constraint);
    auto it = map.find( con );
    return (map.end() != it) ? it->second : -1;
  }